

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int commission_handshake_secret(ptls_t *tls)

{
  byte bVar1;
  uint8_t *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int iVar18;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *paVar19;
  
  puVar2 = tls->pending_handshake_secret;
  if (puVar2 != (uint8_t *)0x0) {
    bVar1 = tls->field_0x160;
    paVar19 = &tls->traffic_protection;
    if ((bVar1 & 1) == 0) {
      paVar19 = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)&(tls->traffic_protection).enc;
    }
    uVar3 = *(undefined4 *)puVar2;
    uVar4 = *(undefined4 *)(puVar2 + 4);
    uVar5 = *(undefined4 *)(puVar2 + 8);
    uVar6 = *(undefined4 *)(puVar2 + 0xc);
    uVar7 = *(undefined4 *)(puVar2 + 0x10);
    uVar8 = *(undefined4 *)(puVar2 + 0x14);
    uVar9 = *(undefined4 *)(puVar2 + 0x18);
    uVar10 = *(undefined4 *)(puVar2 + 0x1c);
    uVar11 = *(undefined4 *)(puVar2 + 0x20);
    uVar12 = *(undefined4 *)(puVar2 + 0x24);
    uVar13 = *(undefined4 *)(puVar2 + 0x28);
    uVar14 = *(undefined4 *)(puVar2 + 0x2c);
    uVar15 = *(undefined4 *)(puVar2 + 0x34);
    uVar16 = *(undefined4 *)(puVar2 + 0x38);
    uVar17 = *(undefined4 *)(puVar2 + 0x3c);
    *(undefined4 *)((paVar19->dec).secret + 0x30) = *(undefined4 *)(puVar2 + 0x30);
    *(undefined4 *)((paVar19->dec).secret + 0x34) = uVar15;
    *(undefined4 *)((paVar19->dec).secret + 0x38) = uVar16;
    *(undefined4 *)((paVar19->dec).secret + 0x3c) = uVar17;
    *(undefined4 *)((paVar19->dec).secret + 0x20) = uVar11;
    *(undefined4 *)((paVar19->dec).secret + 0x24) = uVar12;
    *(undefined4 *)((paVar19->dec).secret + 0x28) = uVar13;
    *(undefined4 *)((paVar19->dec).secret + 0x2c) = uVar14;
    *(undefined4 *)((paVar19->dec).secret + 0x10) = uVar7;
    *(undefined4 *)((paVar19->dec).secret + 0x14) = uVar8;
    *(undefined4 *)((paVar19->dec).secret + 0x18) = uVar9;
    *(undefined4 *)((paVar19->dec).secret + 0x1c) = uVar10;
    *(undefined4 *)(paVar19->dec).secret = uVar3;
    *(undefined4 *)((paVar19->dec).secret + 4) = uVar4;
    *(undefined4 *)((paVar19->dec).secret + 8) = uVar5;
    *(undefined4 *)((paVar19->dec).secret + 0xc) = uVar6;
    (*ptls_clear_memory)(puVar2,0x40);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = (uint8_t *)0x0;
    iVar18 = setup_traffic_protection(tls,bVar1 & 1 ^ 1,(char *)0x0,2,1);
    return iVar18;
  }
  __assert_fail("tls->pending_handshake_secret != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                ,0x4cb,"int commission_handshake_secret(ptls_t *)");
}

Assistant:

static int commission_handshake_secret(ptls_t *tls)
{
    int is_enc = !ptls_is_server(tls);

    assert(tls->pending_handshake_secret != NULL);
    memcpy((is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec)->secret, tls->pending_handshake_secret,
           PTLS_MAX_DIGEST_SIZE);
    ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = NULL;

    return setup_traffic_protection(tls, is_enc, NULL, 2, 1);
}